

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O2

int pl_p2li(int *pxsrc,int xs,short *lldst,int npix)

{
  uint uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ushort *puVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  short *psVar20;
  uint uVar21;
  ulong uVar22;
  
  if (npix < 1) {
    return 0;
  }
  lldst[2] = -100;
  lldst[0] = 0;
  lldst[1] = 7;
  lldst[5] = 0;
  lldst[6] = 0;
  uVar22 = (ulong)xs;
  uVar18 = (ulong)(uint)pxsrc[uVar22 - 1];
  if (pxsrc[uVar22 - 1] < 1) {
    uVar18 = 0;
  }
  uVar17 = 1;
  uVar10 = 0;
  uVar11 = xs;
  iVar9 = 8;
  do {
    uVar15 = (ulong)uVar11;
    uVar12 = (ulong)uVar10;
    do {
      uVar19 = uVar18;
      uVar16 = (uint)uVar19;
      iVar4 = (int)uVar15;
      uVar15 = uVar22 & 0xffffffff;
      uVar5 = (uint)uVar12;
      uVar18 = uVar22;
      do {
        uVar10 = uVar5;
        uVar22 = uVar18 + 1;
        if ((long)(npix + xs) <= (long)uVar18) {
          iVar9 = iVar9 + -1;
          sVar3 = (short)((long)iVar9 / 0x8000);
          lldst[3] = (short)iVar9 + sVar3 * -0x8000;
          lldst[4] = sVar3;
          return iVar9;
        }
        iVar13 = (int)uVar15;
        uVar21 = (uint)uVar22;
        if ((long)(npix + xs + -1) <= (long)uVar18) {
          uVar14 = uVar21;
          if (uVar16 == 0) {
            iVar4 = npix + xs;
          }
          goto LAB_00190943;
        }
        uVar12 = (ulong)(uint)pxsrc[uVar18];
        if (pxsrc[uVar18] < 1) {
          uVar12 = 0;
        }
        uVar14 = iVar13 + 1;
        uVar15 = (ulong)uVar14;
        uVar10 = (uint)uVar12;
        uVar5 = uVar16;
        uVar18 = uVar22;
      } while (uVar10 == uVar16);
      uVar18 = uVar12;
    } while (uVar16 == 0);
LAB_00190943:
    uVar11 = iVar4 - uVar11;
    iVar8 = iVar9;
    if (((int)uVar16 < 1) || (uVar5 = uVar16 - uVar17, uVar5 == 0)) {
LAB_001909ad:
      if (0 < (int)uVar11) {
        psVar20 = lldst + (long)iVar8 + -1;
        lVar6 = (long)iVar8 << 0x20;
        for (; 0 < (int)uVar11; uVar11 = uVar11 - 0xfff) {
          sVar3 = 0xfff;
          if (uVar11 < 0xfff) {
            sVar3 = (short)uVar11;
          }
          *psVar20 = sVar3;
          lVar6 = lVar6 + 0x100000000;
          iVar8 = iVar8 + 1;
          psVar20 = psVar20 + 1;
        }
        if ((0 < (int)uVar16) && (iVar4 == iVar13)) {
          psVar20 = (short *)((long)lldst + (lVar6 >> 0x1f) + -4);
          *psVar20 = *psVar20 + 0x5001;
          goto LAB_00190a18;
        }
      }
      puVar7 = (ushort *)(lldst + (long)iVar8 + -1);
      for (uVar14 = uVar14 - iVar4; 0 < (int)uVar14; uVar14 = uVar14 - 0xfff) {
        uVar11 = 0xfff;
        if (uVar14 < 0xfff) {
          uVar11 = uVar14;
        }
        *puVar7 = (ushort)uVar11 | 0x4000;
        iVar8 = iVar8 + 1;
        puVar7 = puVar7 + 1;
      }
    }
    else {
      uVar1 = -uVar5;
      if (0 < (int)uVar5) {
        uVar1 = uVar5;
      }
      uVar17 = uVar16;
      if (0xfff < uVar1) {
        lldst[(long)iVar9 + -1] = (ushort)uVar19 & 0xfff | 0x1000;
        lldst[iVar9] = (short)(uVar19 >> 0xc);
        iVar8 = iVar9 + 2;
        goto LAB_001909ad;
      }
      uVar2 = 0x3000 - (short)uVar5;
      if (-1 < (int)uVar5) {
        uVar2 = (short)uVar5 + 0x2000;
      }
      lldst[(long)iVar9 + -1] = uVar2;
      iVar8 = iVar9 + 1;
      if ((iVar4 != iVar13) || (uVar11 != 0)) goto LAB_001909ad;
      lldst[(long)iVar9 + -1] = uVar2 | 0x4000;
    }
LAB_00190a18:
    uVar18 = (ulong)uVar10;
    uVar11 = uVar21;
    iVar9 = iVar8;
  } while( true );
}

Assistant:

int pl_p2li (int *pxsrc, int xs, short *lldst, int npix)
/* int *pxsrc;                      input pixel array */
/* int xs;                          starting index in pxsrc (?) */
/* short *lldst;                    encoded line list */
/* int npix;                        number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2, i__3;

    /* Local variables */
    int zero, v, x1, hi, ip, dv, xe, np, op, iz, nv = 0, pv, nz;

    /* Parameter adjustments */
    --lldst;
    --pxsrc;

    /* Function Body */
    if (! (npix <= 0)) {
        goto L110;
    }
    ret_val = 0;
    goto L100;
L110:
    lldst[3] = -100;
    lldst[2] = 7;
    lldst[1] = 0;
    lldst[6] = 0;
    lldst[7] = 0;
    xe = xs + npix - 1;
    op = 8;
    zero = 0;
/* Computing MAX */
    i__1 = zero, i__2 = pxsrc[xs];
    pv = max(i__1,i__2);
    x1 = xs;
    iz = xs;
    hi = 1;
    i__1 = xe;
    for (ip = xs; ip <= i__1; ++ip) {
        if (! (ip < xe)) {
            goto L130;
        }
/* Computing MAX */
        i__2 = zero, i__3 = pxsrc[ip + 1];
        nv = max(i__2,i__3);
        if (! (nv == pv)) {
            goto L140;
        }
        goto L120;
L140:
        if (! (pv == 0)) {
            goto L150;
        }
        pv = nv;
        x1 = ip + 1;
        goto L120;
L150:
        goto L131;
L130:
        if (! (pv == 0)) {
            goto L160;
        }
        x1 = xe + 1;
L160:
L131:
        np = ip - x1 + 1;
        nz = x1 - iz;
        if (! (pv > 0)) {
            goto L170;
        }
        dv = pv - hi;
        if (! (dv != 0)) {
            goto L180;
        }
        hi = pv;
        if (! (abs(dv) > 4095)) {
            goto L190;
        }
        lldst[op] = (short) ((pv & 4095) + 4096);
        ++op;
        lldst[op] = (short) (pv / 4096);
        ++op;
        goto L191;
L190:
        if (! (dv < 0)) {
            goto L200;
        }
        lldst[op] = (short) (-dv + 12288);
        goto L201;
L200:
        lldst[op] = (short) (dv + 8192);
L201:
        ++op;
        if (! (np == 1 && nz == 0)) {
            goto L210;
        }
        v = lldst[op - 1];
        lldst[op - 1] = (short) (v | 16384);
        goto L91;
L210:
L191:
L180:
L170:
        if (! (nz > 0)) {
            goto L220;
        }
L230:
        if (! (nz > 0)) {
            goto L232;
        }
        lldst[op] = (short) min(4095,nz);
        ++op;
/* L231: */
        nz += -4095;
        goto L230;
L232:
        if (! (np == 1 && pv > 0)) {
            goto L240;
        }
        lldst[op - 1] = (short) (lldst[op - 1] + 20481);
        goto L91;
L240:
L220:
L250:
        if (! (np > 0)) {
            goto L252;
        }
        lldst[op] = (short) (min(4095,np) + 16384);
        ++op;
/* L251: */
        np += -4095;
        goto L250;
L252:
L91:
        x1 = ip + 1;
        iz = x1;
        pv = nv;
L120:
        ;
    }
/* L121: */
    lldst[4] = (short) ((op - 1) % 32768);
    lldst[5] = (short) ((op - 1) / 32768);
    ret_val = op - 1;
    goto L100;
L100:
    return ret_val;
}